

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  ushort uVar1;
  bool bVar2;
  short sVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  stbi_uc sVar12;
  stbi_uc sVar13;
  stbi_uc sVar14;
  stbi_uc sVar15;
  byte bVar16;
  byte bVar17;
  stbi_uc sVar18;
  byte bVar19;
  stbi__uint32 sVar20;
  stbi__uint32 sVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  stbi__uint32 sVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  char *pcVar31;
  stbi_uc *psVar32;
  stbi__context *psVar33;
  undefined7 extraout_var;
  size_t sVar34;
  stbi__uint16 *psVar35;
  float *data;
  void *pvVar36;
  undefined1 uVar37;
  ulong uVar38;
  ulong uVar39;
  uint extraout_EDX;
  uint extraout_EDX_00;
  long lVar40;
  stbi_uc *psVar41;
  uint uVar42;
  ulong unaff_RBP;
  void *pvVar43;
  uint uVar44;
  stbi__context *psVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  undefined4 in_register_00000084;
  stbi__context *psVar49;
  stbi__context *psVar50;
  ulong uVar51;
  stbi_uc *psVar52;
  int iVar53;
  long lVar54;
  ulong uVar55;
  stbi__context *unaff_R15;
  long in_FS_OFFSET;
  bool bVar56;
  bool bVar57;
  float fVar58;
  float fVar59;
  uint local_9790;
  uint local_978c;
  uint local_9780;
  uint local_9768;
  ulong local_9760;
  void *local_9758;
  stbi_uc tc [3];
  uint local_974c;
  int local_9740;
  ulong local_9730;
  int local_96f8;
  stbi__png local_96f0;
  stbi__uint16 local_96c6 [3];
  undefined8 local_96c0;
  long local_96b8;
  long local_96b0;
  stbi__uint16 *local_96a8;
  uint local_969c;
  size_t local_9698;
  ulong local_9690;
  ulong local_9688;
  stbi_uc *local_9680;
  undefined8 local_9678;
  undefined7 uStack_9670;
  undefined4 uStack_9669;
  byte bStack_9659;
  stbi_uc lencodes [455];
  stbi_uc palette [1024];
  undefined1 local_9088 [36];
  int iStack_9064;
  undefined8 local_9060;
  undefined8 local_9058;
  stbi_uc local_9050 [4];
  stbi__zhuffman local_904c;
  stbi__zhuffman local_8868 [16];
  stbi__uint16 *local_850;
  uint local_848;
  int local_844;
  uint local_840;
  int local_83c;
  int local_838;
  int local_834;
  int local_830;
  int local_82c;
  int local_828;
  int local_824;
  int local_820;
  stbi__zhuffman z_codelength;
  
  uVar42 = (uint)unaff_RBP;
  psVar49 = (stbi__context *)CONCAT44(in_register_00000084,req_comp);
  psVar49->img_n = 0;
  psVar49->img_x = 8;
  psVar49->img_y = 0;
  lVar54 = 0;
  psVar50 = psVar49;
  do {
    sVar12 = stbi__get8(s);
    iVar26 = (int)psVar50;
    sVar18 = (&stbi__check_png_header_png_sig)[lVar54];
    if (sVar12 != sVar18) {
      *(char **)(in_FS_OFFSET + -8) = "bad png sig";
      break;
    }
    lVar54 = lVar54 + 1;
  } while (lVar54 != 8);
  sVar20 = (stbi__uint32)lVar54;
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar12 == sVar18) {
    tc[2] = '\0';
    tc[0] = '\0';
    tc[1] = '\0';
    local_96f0.idata = (stbi_uc *)0x0;
    local_96f0.expanded = (stbi_uc *)0x0;
    local_96f0.out = (stbi_uc *)0x0;
    lVar54 = 0;
    local_96f0.s = s;
    do {
      sVar12 = stbi__get8(s);
      sVar18 = (&stbi__check_png_header_png_sig)[lVar54];
      if (sVar12 != sVar18) {
        *(char **)(in_FS_OFFSET + -8) = "bad png sig";
        break;
      }
      lVar54 = lVar54 + 1;
    } while (lVar54 != 8);
    if (sVar12 == sVar18) {
      bVar57 = true;
      local_9690 = 0;
      uVar42 = 0;
      bVar56 = false;
      local_9730 = 0;
      local_9698 = 0;
      uVar29 = 0;
      local_96c0 = 0;
      local_9790 = 0;
      do {
        sVar20 = stbi__get32be(s);
        sVar34 = (size_t)sVar20;
        sVar21 = stbi__get32be(s);
        psVar41 = local_96f0.idata;
        uVar46 = (uint)local_9730;
        uVar22 = uVar29;
        if ((int)sVar21 < 0x49484452) {
          if (sVar21 == 0x43674249) {
            bVar56 = true;
LAB_00115713:
            stbi__skip(s,sVar20);
LAB_001163db:
            stbi__get32be(s);
            bVar4 = true;
            uVar29 = uVar22;
          }
          else {
            if (sVar21 != 0x49444154) {
              if (sVar21 != 0x49454e44) {
LAB_00115752:
                if (!bVar57) {
                  bVar57 = false;
                  if ((sVar21 >> 0x1d & 1) == 0) {
                    stbi__parse_png_file_invalid_chunk._0_4_ =
                         sVar21 >> 0x18 | (sVar21 & 0xff0000) >> 8 | (sVar21 & 0xff00) << 8 |
                         sVar21 << 0x18;
                    pcVar31 = stbi__parse_png_file_invalid_chunk;
                    goto LAB_00116758;
                  }
                  goto LAB_00115713;
                }
                goto LAB_001157d4;
              }
              if (bVar57) {
                pcVar31 = "first not IHDR";
              }
              else {
                if ((stbi__context *)local_96f0.idata != (stbi__context *)0x0) {
                  local_974c = s->img_n * s->img_y * (local_96f0.depth * s->img_x + 7 >> 3) +
                               s->img_y;
                  psVar32 = (stbi_uc *)malloc((long)(int)local_974c);
                  if (psVar32 == (stbi_uc *)0x0) {
LAB_00116887:
                    psVar41 = (stbi_uc *)0x0;
                  }
                  else {
                    local_9088._8_8_ = (stbi_uc *)((long)psVar41 + 0x38) + (long)(int)uVar29 + -0x38
                    ;
                    local_9058 = psVar32 + (int)local_974c;
                    local_9088._0_8_ = psVar41;
                    local_9050[0] = '\x01';
                    local_9050[1] = '\0';
                    local_9050[2] = '\0';
                    local_9050[3] = '\0';
                    unique0x100045d2 = psVar32;
                    local_9060 = psVar32;
                    if (!bVar56) {
                      uVar46 = 0;
                      uVar22 = 0;
                      if (0 < (int)uVar29) {
                        local_9088._0_8_ = (long)(stbi__uint32 *)psVar41 + 1;
                        uVar22 = (uint)(byte)*(stbi__uint32 *)psVar41;
                      }
                      if ((ulong)local_9088._0_8_ < (ulong)local_9088._8_8_) {
                        uVar46 = (uint)(byte)*(stbi__uint32 *)local_9088._0_8_;
                        local_9088._0_8_ =
                             (stbi__context *)((long)(stbi__uint32 *)local_9088._0_8_ + 1);
                      }
                      if (((ulong)local_9088._0_8_ < (ulong)local_9088._8_8_) &&
                         ((uVar22 << 8 | uVar46) * -0x42108421 < 0x8421085)) {
                        if ((uVar46 & 0x20) == 0) {
                          if ((uVar22 & 0xf) == 8) goto LAB_0011588c;
                          pcVar31 = "bad compression";
                        }
                        else {
                          pcVar31 = "no preset dict";
                        }
                      }
                      else {
                        pcVar31 = "bad zlib header";
                      }
LAB_00116566:
                      *(char **)(in_FS_OFFSET + -8) = pcVar31;
switchD_001159b8_caseD_3:
                      free(local_9060);
                      goto LAB_00116887;
                    }
LAB_0011588c:
                    local_9088._16_8_ = (stbi_uc *)0x0;
                    local_9088._24_8_ = local_9088._24_8_ & 0xffffffff00000000;
                    do {
                      uVar7 = local_9088._8_8_;
                      if ((int)local_9088._16_4_ < 1) {
                        psVar33 = (stbi__context *)local_9088._0_8_;
                        iVar26 = local_9088._16_4_;
                        uVar22 = local_9088._24_4_;
                        do {
                          bVar17 = (byte)iVar26 & 0x1f;
                          if (uVar22 >> bVar17 != 0) {
                            local_9088._0_8_ = local_9088._8_8_;
                            break;
                          }
                          uVar46 = 0 >> bVar17;
                          psVar45 = psVar33;
                          if (psVar33 < (ulong)local_9088._8_8_) {
                            psVar45 = (stbi__context *)((long)&psVar33->img_x + 1);
                            uVar46 = (uint)(byte)psVar33->img_x;
                            psVar50 = psVar45;
                            local_9088._0_8_ = psVar45;
                          }
                          uVar22 = uVar22 | uVar46 << ((byte)iVar26 & 0x1f);
                          local_9088._24_4_ = uVar22;
                          local_9088._16_4_ = iVar26 + 8;
                          bVar2 = iVar26 < 0x11;
                          psVar33 = psVar45;
                          iVar26 = iVar26 + 8;
                        } while (bVar2);
                      }
                      uVar6 = local_9088._24_8_;
                      uVar22 = (uint)local_9088._24_4_ >> 1;
                      iVar26 = local_9088._16_4_ + -1;
                      bVar2 = (int)local_9088._16_4_ < 3;
                      psVar33 = (stbi__context *)local_9088._0_8_;
                      local_9088._24_4_ = uVar22;
                      local_9088._16_4_ = iVar26;
                      if (bVar2) {
                        do {
                          bVar17 = (byte)iVar26 & 0x1f;
                          if (uVar22 >> bVar17 != 0) {
                            local_9088._0_8_ = local_9088._8_8_;
                            uVar23 = uVar22 >> 2;
                            local_9088._24_4_ = uVar23;
                            uVar46 = iVar26 - 2;
                            local_9088._16_4_ = uVar46;
                            switch(uVar22 & 3) {
                            case 0:
                              goto switchD_001159b8_caseD_0;
                            case 1:
                              goto switchD_001159b8_caseD_1;
                            case 2:
                              goto switchD_001159b8_caseD_2;
                            }
                            goto switchD_001159b8_caseD_3;
                          }
                          uVar46 = 0 >> bVar17;
                          psVar45 = psVar33;
                          if (psVar33 < (ulong)local_9088._8_8_) {
                            psVar45 = (stbi__context *)((long)&psVar33->img_x + 1);
                            uVar46 = (uint)(byte)psVar33->img_x;
                            psVar50 = psVar45;
                            local_9088._0_8_ = psVar45;
                          }
                          uVar22 = uVar22 | uVar46 << ((byte)iVar26 & 0x1f);
                          local_9088._16_4_ = iVar26 + 8;
                          bVar2 = iVar26 < 0x11;
                          psVar33 = psVar45;
                          iVar26 = local_9088._16_4_;
                          local_9088._24_4_ = uVar22;
                        } while (bVar2);
                      }
                      iVar26 = local_9088._16_4_;
                      uVar22 = local_9088._24_4_ & 3;
                      uVar23 = (uint)local_9088._24_4_ >> 2;
                      local_9088._24_4_ = uVar23;
                      uVar46 = local_9088._16_4_ - 2;
                      local_9088._16_4_ = uVar46;
                      switch(uVar22) {
                      case 0:
switchD_001159b8_caseD_0:
                        if ((uVar46 & 7) != 0) {
                          stbi__zreceive((stbi__zbuf *)local_9088,uVar46 & 7);
                        }
                        if ((int)local_9088._16_4_ < 1) {
                          uVar38 = 0;
                          iVar26 = local_9088._16_4_;
                        }
                        else {
                          uVar38 = 0;
                          iVar53 = local_9088._16_4_;
                          uVar22 = local_9088._24_4_;
                          do {
                            *(char *)((long)z_codelength.fast + uVar38) = (char)uVar22;
                            uVar38 = uVar38 + 1;
                            uVar22 = uVar22 >> 8;
                            iVar26 = iVar53 + -8;
                            bVar2 = 8 < iVar53;
                            iVar53 = iVar26;
                          } while (bVar2);
                          local_9088._24_4_ = uVar22;
                          local_9088._16_4_ = iVar26;
                        }
                        if (iVar26 < 0) {
LAB_00116787:
                          pcVar31 = "zlib corrupt";
                        }
                        else {
                          if ((uint)uVar38 < 4) {
                            uVar38 = uVar38 & 0xffffffff;
                            psVar33 = (stbi__context *)local_9088._0_8_;
                            do {
                              if (psVar33 < (ulong)local_9088._8_8_) {
                                local_9088._0_8_ = (long)&psVar33->img_x + 1;
                                uVar37 = (undefined1)psVar33->img_x;
                                psVar33 = (stbi__context *)local_9088._0_8_;
                              }
                              else {
                                uVar37 = 0;
                              }
                              *(undefined1 *)((long)z_codelength.fast + uVar38) = uVar37;
                              uVar38 = uVar38 + 1;
                            } while (uVar38 != 4);
                          }
                          if ((z_codelength.fast[1] ^ z_codelength.fast[0]) != 0xffff)
                          goto LAB_00116787;
                          uVar38 = (ulong)z_codelength.fast[0];
                          if ((stbi__context *)
                              ((stbi_uc *)(local_9088._0_8_ + 0x38) + (uVar38 - 0x38)) <=
                              (ulong)local_9088._8_8_) {
                            if ((stack0xffffffffffff6f98 + uVar38 <= local_9058) ||
                               (iVar26 = stbi__zexpand((stbi__zbuf *)local_9088,
                                                       (char *)stack0xffffffffffff6f98,
                                                       (uint)z_codelength.fast[0]), iVar26 != 0)) {
                              memcpy(stack0xffffffffffff6f98,(void *)local_9088._0_8_,uVar38);
                              local_9088._0_8_ =
                                   (stbi_uc *)(local_9088._0_8_ + 0x38) + (uVar38 - 0x38);
                              unique0x00006b80 = stack0xffffffffffff6f98 + uVar38;
                              goto LAB_001162e5;
                            }
                            goto switchD_001159b8_caseD_3;
                          }
                          pcVar31 = "read past buffer";
                        }
                        goto LAB_00116566;
                      case 1:
switchD_001159b8_caseD_1:
                        iVar26 = stbi__zbuild_huffman
                                           (&local_904c,
                                            "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                                            ,0x120);
                        if (iVar26 == 0) goto switchD_001159b8_caseD_3;
                        iVar26 = stbi__zbuild_huffman
                                           (local_8868,
                                            "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                                            ,0x20);
                        psVar41 = stack0xffffffffffff6f98;
                        break;
                      case 2:
switchD_001159b8_caseD_2:
                        psVar50 = (stbi__context *)local_9088._0_8_;
                        if (iVar26 < 7) {
                          do {
                            bVar17 = (byte)uVar46 & 0x1f;
                            if (uVar23 >> bVar17 != 0) {
                              local_9088._0_8_ = local_9088._8_8_;
                              break;
                            }
                            uVar22 = 0 >> bVar17;
                            psVar33 = psVar50;
                            if (psVar50 < (ulong)local_9088._8_8_) {
                              psVar33 = (stbi__context *)((long)&psVar50->img_x + 1);
                              uVar22 = (uint)(byte)psVar50->img_x;
                              local_9088._0_8_ = psVar33;
                            }
                            uVar23 = uVar23 | uVar22 << ((byte)uVar46 & 0x1f);
                            local_9088._24_4_ = uVar23;
                            local_9088._16_4_ = uVar46 + 8;
                            bVar2 = (int)uVar46 < 0x11;
                            psVar50 = psVar33;
                            uVar46 = uVar46 + 8;
                          } while (bVar2);
                        }
                        uVar9 = local_9088._24_8_;
                        uVar8 = local_9088._16_8_;
                        uVar5 = local_9088._24_4_;
                        local_9088._24_4_ = (uint)local_9088._24_4_ >> 5;
                        iVar26 = local_9088._16_4_ + -5;
                        bVar2 = (int)local_9088._16_4_ < 10;
                        psVar50 = (stbi__context *)local_9088._0_8_;
                        local_9088._16_4_ = iVar26;
                        if (bVar2) {
                          do {
                            bVar17 = (byte)iVar26 & 0x1f;
                            if ((uint)local_9088._24_4_ >> bVar17 != 0) {
                              local_9088._0_8_ = local_9088._8_8_;
                              local_9088._16_4_ = iVar26;
                              break;
                            }
                            uVar22 = 0 >> bVar17;
                            psVar33 = psVar50;
                            if (psVar50 < (ulong)local_9088._8_8_) {
                              psVar33 = (stbi__context *)((long)&psVar50->img_x + 1);
                              uVar22 = (uint)(byte)psVar50->img_x;
                              local_9088._0_8_ = psVar33;
                            }
                            local_9088._24_4_ = local_9088._24_4_ | uVar22 << ((byte)iVar26 & 0x1f);
                            local_9088._16_4_ = iVar26 + 8;
                            bVar2 = iVar26 < 0x11;
                            psVar50 = psVar33;
                            iVar26 = local_9088._16_4_;
                          } while (bVar2);
                        }
                        uVar11 = local_9088._24_4_;
                        local_9088._24_4_ = (uint)local_9088._24_4_ >> 5;
                        iVar26 = local_9088._16_4_ + -5;
                        bVar2 = (int)local_9088._16_4_ < 9;
                        psVar50 = (stbi__context *)local_9088._0_8_;
                        local_9088._16_4_ = iVar26;
                        if (bVar2) {
                          do {
                            bVar17 = (byte)iVar26 & 0x1f;
                            if ((uint)local_9088._24_4_ >> bVar17 != 0) {
                              local_9088._0_8_ = local_9088._8_8_;
                              local_9088._16_4_ = iVar26;
                              break;
                            }
                            uVar22 = 0 >> bVar17;
                            psVar33 = psVar50;
                            if (psVar50 < (ulong)local_9088._8_8_) {
                              psVar33 = (stbi__context *)((long)&psVar50->img_x + 1);
                              uVar22 = (uint)(byte)psVar50->img_x;
                              local_9088._0_8_ = psVar33;
                            }
                            local_9088._24_4_ = local_9088._24_4_ | uVar22 << ((byte)iVar26 & 0x1f);
                            local_9088._16_4_ = iVar26 + 8;
                            bVar2 = iVar26 < 0x11;
                            psVar50 = psVar33;
                            iVar26 = local_9088._16_4_;
                          } while (bVar2);
                        }
                        iVar26 = (uVar5 & 0x1f) + 0x101;
                        iVar28 = (uVar11 & 0x1f) + 1;
                        uVar22 = local_9088._24_4_ & 0xf;
                        uVar46 = (uint)local_9088._24_4_ >> 4;
                        local_9088._24_8_ = uVar9 & 0xffffffff00000000;
                        iVar53 = local_9088._16_4_ + -4;
                        local_9088._16_8_ = uVar8 & 0xffffffff00000000;
                        local_9678 = 0;
                        uStack_9670 = 0;
                        uStack_9669 = 0;
                        psVar50 = (stbi__context *)0x0;
                        psVar33 = (stbi__context *)local_9088._0_8_;
                        do {
                          psVar45 = psVar33;
                          uVar23 = uVar46;
                          iVar30 = iVar53;
                          uVar10 = local_9088._28_4_;
                          uVar11 = local_9088._20_4_;
                          if (iVar53 < 3) {
                            do {
                              uVar11 = local_9088._20_4_;
                              uVar10 = local_9088._28_4_;
                              bVar17 = (byte)iVar53 & 0x1f;
                              if (uVar46 >> bVar17 != 0) {
                                local_9088._0_8_ = uVar7;
                                psVar33 = (stbi__context *)uVar7;
                                uVar23 = uVar46;
                                iVar30 = iVar53;
                                break;
                              }
                              uVar23 = 0 >> bVar17;
                              if (psVar45 < (ulong)uVar7) {
                                psVar33 = (stbi__context *)((long)&psVar45->img_x + 1);
                                uVar23 = (uint)(byte)psVar45->img_x;
                                psVar45 = psVar33;
                                local_9088._0_8_ = psVar33;
                              }
                              uVar46 = uVar46 | uVar23 << ((byte)iVar53 & 0x1f);
                              local_9088._24_8_ = local_9088._24_8_ & 0xffffffff00000000;
                              iVar30 = iVar53 + 8;
                              local_9088._16_8_ = local_9088._16_8_ & 0xffffffff00000000;
                              bVar2 = iVar53 < 0x11;
                              uVar23 = uVar46;
                              iVar53 = iVar30;
                            } while (bVar2);
                          }
                          local_9088._20_4_ = uVar11;
                          local_9088._28_4_ = uVar10;
                          uVar46 = uVar23 >> 3;
                          local_9088._24_4_ = uVar46;
                          iVar53 = iVar30 + -3;
                          local_9088._16_4_ = iVar53;
                          *(byte *)((long)&local_9678 + (ulong)psVar50[0x1551].buffer_start[0x58]) =
                               (byte)uVar23 & 7;
                          psVar50 = (stbi__context *)((long)&psVar50->img_x + 1);
                        } while (psVar50 != (stbi__context *)((ulong)uVar22 + 4));
                        iVar53 = stbi__zbuild_huffman(&z_codelength,(stbi_uc *)&local_9678,0x13);
                        if (iVar53 == 0) goto switchD_001159b8_caseD_3;
                        uVar22 = iVar26 + iVar28;
                        unaff_RBP = (ulong)uVar22;
                        uVar46 = 0;
                        while( true ) {
                          if ((int)uVar22 <= (int)uVar46) break;
                          uVar23 = stbi__zhuffman_decode((stbi__zbuf *)local_9088,&z_codelength);
                          if (uVar23 < 0x13) {
                            if ((int)uVar23 < 0x10) {
                              lVar54 = (long)(int)uVar46;
                              uVar46 = uVar46 + 1;
                              lencodes[lVar54] = (stbi_uc)uVar23;
                              bVar2 = true;
                            }
                            else {
                              if (uVar23 == 0x11) {
                                psVar33 = (stbi__context *)local_9088._0_8_;
                                iVar53 = local_9088._16_4_;
                                uVar23 = local_9088._24_4_;
                                if ((int)local_9088._16_4_ < 3) {
                                  do {
                                    bVar17 = (byte)iVar53 & 0x1f;
                                    if (uVar23 >> bVar17 != 0) {
                                      local_9088._0_8_ = local_9088._8_8_;
                                      break;
                                    }
                                    uVar47 = 0 >> bVar17;
                                    psVar45 = psVar33;
                                    if (psVar33 < (ulong)local_9088._8_8_) {
                                      psVar45 = (stbi__context *)((long)&psVar33->img_x + 1);
                                      uVar47 = (uint)(byte)psVar33->img_x;
                                      psVar50 = psVar45;
                                      local_9088._0_8_ = psVar45;
                                    }
                                    uVar23 = uVar23 | uVar47 << ((byte)iVar53 & 0x1f);
                                    local_9088._24_4_ = uVar23;
                                    local_9088._16_4_ = iVar53 + 8;
                                    bVar2 = iVar53 < 0x11;
                                    psVar33 = psVar45;
                                    iVar53 = iVar53 + 8;
                                  } while (bVar2);
                                }
                                uVar11 = local_9088._24_4_;
                                local_9088._24_4_ = (uint)local_9088._24_4_ >> 3;
                                local_9088._16_4_ = local_9088._16_4_ + -3;
                                uVar23 = (uVar11 & 7) + 3;
LAB_00116050:
                                uVar47 = 0;
LAB_00116052:
                                if ((int)uVar23 <= (int)(uVar22 - uVar46)) {
                                  memset(lencodes + (int)uVar46,uVar47,(ulong)uVar23);
                                  uVar46 = uVar46 + uVar23;
                                  bVar2 = true;
                                  goto LAB_00116091;
                                }
                                *(char **)(in_FS_OFFSET + -8) = "bad codelengths";
                              }
                              else {
                                if (uVar23 != 0x10) {
                                  psVar33 = (stbi__context *)local_9088._0_8_;
                                  iVar53 = local_9088._16_4_;
                                  uVar23 = local_9088._24_4_;
                                  if ((int)local_9088._16_4_ < 7) {
                                    do {
                                      bVar17 = (byte)iVar53 & 0x1f;
                                      if (uVar23 >> bVar17 != 0) {
                                        local_9088._0_8_ = local_9088._8_8_;
                                        break;
                                      }
                                      uVar47 = 0 >> bVar17;
                                      psVar45 = psVar33;
                                      if (psVar33 < (ulong)local_9088._8_8_) {
                                        psVar45 = (stbi__context *)((long)&psVar33->img_x + 1);
                                        uVar47 = (uint)(byte)psVar33->img_x;
                                        psVar50 = psVar45;
                                        local_9088._0_8_ = psVar45;
                                      }
                                      uVar23 = uVar23 | uVar47 << ((byte)iVar53 & 0x1f);
                                      local_9088._24_4_ = uVar23;
                                      local_9088._16_4_ = iVar53 + 8;
                                      bVar2 = iVar53 < 0x11;
                                      psVar33 = psVar45;
                                      iVar53 = iVar53 + 8;
                                    } while (bVar2);
                                  }
                                  uVar11 = local_9088._24_4_;
                                  local_9088._24_4_ = (uint)local_9088._24_4_ >> 7;
                                  local_9088._16_4_ = local_9088._16_4_ + -7;
                                  uVar23 = (uVar11 & 0x7f) + 0xb;
                                  goto LAB_00116050;
                                }
                                psVar33 = (stbi__context *)local_9088._0_8_;
                                iVar53 = local_9088._16_4_;
                                uVar23 = local_9088._24_4_;
                                if ((int)local_9088._16_4_ < 2) {
                                  do {
                                    bVar17 = (byte)iVar53 & 0x1f;
                                    if (uVar23 >> bVar17 != 0) {
                                      local_9088._0_8_ = local_9088._8_8_;
                                      break;
                                    }
                                    uVar47 = 0 >> bVar17;
                                    psVar45 = psVar33;
                                    if (psVar33 < (ulong)local_9088._8_8_) {
                                      psVar45 = (stbi__context *)((long)&psVar33->img_x + 1);
                                      local_9088._0_8_ = psVar45;
                                      uVar47 = (uint)(byte)psVar33->img_x;
                                      psVar50 = psVar45;
                                    }
                                    uVar23 = uVar23 | uVar47 << ((byte)iVar53 & 0x1f);
                                    local_9088._24_4_ = uVar23;
                                    local_9088._16_4_ = iVar53 + 8;
                                    bVar2 = iVar53 < 0x11;
                                    psVar33 = psVar45;
                                    iVar53 = iVar53 + 8;
                                  } while (bVar2);
                                }
                                uVar11 = local_9088._24_4_;
                                local_9088._24_4_ = (uint)local_9088._24_4_ >> 2;
                                local_9088._16_4_ = local_9088._16_4_ + -2;
                                if (uVar46 != 0) {
                                  uVar23 = (uVar11 & 3) + 3;
                                  uVar47 = (uint)lencodes[(long)(int)uVar46 + -1];
                                  goto LAB_00116052;
                                }
                                *(char **)(in_FS_OFFSET + -8) = "bad codelengths";
                                uVar46 = 0;
                              }
                              bVar2 = false;
                            }
                          }
                          else {
                            *(char **)(in_FS_OFFSET + -8) = "bad codelengths";
                            bVar2 = false;
                          }
LAB_00116091:
                          if (!bVar2) goto switchD_001159b8_caseD_3;
                        }
                        if (uVar22 != uVar46) {
                          *(char **)(in_FS_OFFSET + -8) = "bad codelengths";
                          goto switchD_001159b8_caseD_3;
                        }
                        iVar26 = stbi__zbuild_huffman(&local_904c,lencodes,iVar26);
                        if (iVar26 == 0) goto switchD_001159b8_caseD_3;
                        iVar26 = stbi__zbuild_huffman
                                           (local_8868,lencodes + (ulong)(uVar5 & 0x1f) + 0x101,
                                            iVar28);
                        psVar41 = stack0xffffffffffff6f98;
                        break;
                      case 3:
                        goto switchD_001159b8_caseD_3;
                      }
                      unique0x1000446e = psVar41;
                      if (iVar26 == 0) goto switchD_001159b8_caseD_3;
                      do {
                        iVar26 = stbi__zhuffman_decode((stbi__zbuf *)local_9088,&local_904c);
                        if (iVar26 < 0x100) {
                          if (iVar26 < 0) {
LAB_001161da:
                            pcVar31 = "bad huffman code";
LAB_001161e1:
                            *(char **)(in_FS_OFFSET + -8) = pcVar31;
                          }
                          else {
                            psVar32 = psVar41;
                            if ((psVar41 < local_9058) ||
                               (iVar53 = stbi__zexpand((stbi__zbuf *)local_9088,(char *)psVar41,1),
                               psVar32 = stack0xffffffffffff6f98, iVar53 != 0)) {
                              *psVar32 = (stbi_uc)iVar26;
                              psVar41 = psVar32 + 1;
                              bVar2 = true;
                              goto LAB_001161ef;
                            }
                          }
LAB_001161ea:
                          bVar2 = false;
                          unaff_RBP = 0;
                        }
                        else {
                          if (iVar26 != 0x100) {
                            if (iVar26 < 0x11e) {
                              uVar38 = (ulong)(iVar26 - 0x101);
                              uVar22 = stbi__zlength_base[uVar38];
                              if (0xffffffffffffffeb < uVar38 - 0x1c) {
                                uVar46 = stbi__zreceive((stbi__zbuf *)local_9088,
                                                        stbi__zlength_extra[uVar38]);
                                uVar22 = uVar22 + uVar46;
                              }
                              uVar38 = (ulong)uVar22;
                              uVar46 = stbi__zhuffman_decode((stbi__zbuf *)local_9088,local_8868);
                              if (uVar46 < 0x1e) {
                                uVar39 = (ulong)uVar46;
                                iVar26 = stbi__zdist_base[uVar39];
                                if (0xffffffffffffffe5 < uVar39 - 0x1e) {
                                  uVar46 = stbi__zreceive((stbi__zbuf *)local_9088,
                                                          stbi__zdist_extra[uVar39]);
                                  iVar26 = iVar26 + uVar46;
                                }
                                if ((long)psVar41 - (long)local_9060 < (long)iVar26) {
                                  pcVar31 = "bad dist";
                                  goto LAB_001161e1;
                                }
                                psVar32 = psVar41;
                                if (((long)local_9058 - (long)psVar41 < (long)(int)uVar22) &&
                                   (iVar53 = stbi__zexpand((stbi__zbuf *)local_9088,(char *)psVar41,
                                                           uVar22),
                                   psVar32 = stack0xffffffffffff6f98, iVar53 == 0))
                                goto LAB_001161ea;
                                psVar41 = psVar32;
                                lVar54 = -(long)iVar26;
                                if (iVar26 == 1) {
                                  bVar2 = true;
                                  if (uVar22 != 0) {
                                    memset(psVar41,(uint)psVar41[lVar54],uVar38);
                                    psVar41 = psVar41 + (ulong)(uVar22 - 1) + 1;
                                  }
                                }
                                else {
                                  bVar2 = true;
                                  while (uVar22 != 0) {
                                    *psVar41 = psVar41[lVar54];
                                    psVar41 = psVar41 + 1;
                                    uVar22 = (int)uVar38 - 1;
                                    uVar38 = (ulong)uVar22;
                                  }
                                }
                                goto LAB_001161ef;
                              }
                            }
                            goto LAB_001161da;
                          }
                          bVar2 = false;
                          unaff_RBP = 1;
                          unique0x10004446 = psVar41;
                          if ((local_9088._20_4_ != 0) && ((int)local_9088._16_4_ < 0x10)) {
                            pcVar31 = "unexpected end";
                            goto LAB_001161e1;
                          }
                        }
LAB_001161ef:
                      } while (bVar2);
                      if ((int)unaff_RBP == 0) goto switchD_001159b8_caseD_3;
LAB_001162e5:
                    } while ((uVar6 & 1) == 0);
                    local_974c = local_9088._32_4_ - (int)local_9060;
                    psVar41 = local_9060;
                  }
                  local_96f0.expanded = psVar41;
                  if (psVar41 == (stbi_uc *)0x0) {
LAB_00116e50:
                    lVar54 = 0;
                  }
                  else {
                    free(local_96f0.idata);
                    local_96f0.idata = (stbi_uc *)0x0;
                    iVar26 = s->img_n + 1;
                    iVar53 = s->img_n;
                    if ((char)local_96c0 != '\0') {
                      iVar53 = iVar26;
                    }
                    iVar28 = iVar53;
                    if ((char)local_9790 == '\0') {
                      iVar28 = iVar26;
                    }
                    if (iVar26 != 4) {
                      iVar28 = iVar53;
                    }
                    s->img_out_n = iVar28;
                    uVar38 = (ulong)(uint)local_96f0.depth;
                    uVar46 = iVar28 << (local_96f0.depth == 0x10U);
                    unaff_RBP = (ulong)uVar46;
                    uVar22 = (local_96f0.s)->img_x;
                    psVar50 = (stbi__context *)(ulong)uVar22;
                    if ((int)local_9690 == 0) {
                      iVar26 = stbi__create_png_image_raw
                                         (&local_96f0,psVar41,local_974c,iVar28,uVar22,
                                          (local_96f0.s)->img_y,local_96f0.depth,uVar42);
                      if (iVar26 != 0) goto LAB_00116bfe;
                      goto LAB_00116e50;
                    }
                    local_96a8 = (stbi__uint16 *)
                                 stbi__malloc_mad3(uVar22,(local_96f0.s)->img_y,uVar46,0);
                    if (local_96a8 == (stbi__uint16 *)0x0) {
                      *(char **)(in_FS_OFFSET + -8) = "outofmem";
                      goto LAB_00116e50;
                    }
                    sVar34 = (size_t)(int)uVar46;
                    lVar54 = 0;
                    unaff_RBP = uVar38;
                    local_969c = uVar46;
                    local_9688 = uVar38;
                    do {
                      uVar22 = (&DAT_0012a990)[lVar54];
                      uVar46 = (&DAT_0012a9d0)[lVar54];
                      uVar44 = ~uVar22 + (local_96f0.s)->img_x + uVar46;
                      uVar24 = uVar44 / uVar46;
                      uVar23 = (&DAT_0012a9b0)[lVar54];
                      uVar47 = (&DAT_0012a9f0)[lVar54];
                      uVar48 = ~uVar23 + (local_96f0.s)->img_y + uVar47;
                      psVar50 = (stbi__context *)(ulong)uVar48;
                      uVar25 = uVar48 / uVar47;
                      bVar2 = true;
                      if ((uVar46 <= uVar44) && (uVar47 <= uVar48)) {
                        psVar50 = (stbi__context *)(ulong)uVar24;
                        local_96b8 = CONCAT44(local_96b8._4_4_,
                                              uVar24 * (int)unaff_RBP * (local_96f0.s)->img_n);
                        local_96b0 = lVar54;
                        iVar26 = stbi__create_png_image_raw
                                           (&local_96f0,psVar41,local_974c,iVar28,uVar24,uVar25,
                                            (int)unaff_RBP,uVar42);
                        psVar32 = local_96f0.out;
                        psVar33 = local_96f0.s;
                        if (iVar26 == 0) {
                          free(local_96a8);
                          bVar2 = false;
                          lVar54 = local_96b0;
                        }
                        else {
                          local_9680 = psVar41;
                          if (0 < (int)uVar25) {
                            iVar26 = uVar23 * local_969c;
                            iVar53 = uVar47 * local_969c;
                            psVar41 = (stbi_uc *)((long)local_96a8 + (long)(int)uVar22 * sVar34);
                            psVar50 = (stbi__context *)((long)(int)uVar46 * sVar34);
                            local_9760 = 0;
                            do {
                              if (0 < (int)uVar24) {
                                lVar54 = 0;
                                psVar52 = psVar41;
                                do {
                                  memcpy(psVar52 + psVar33->img_x * iVar26,
                                         (stbi__uint16 *)
                                         ((long)psVar32 +
                                         (local_9760 * (long)(int)uVar24 + lVar54) * sVar34),sVar34)
                                  ;
                                  lVar54 = lVar54 + 1;
                                  psVar52 = psVar50->buffer_start + (long)(psVar52 + -0x38);
                                } while (lVar54 < (int)uVar24);
                              }
                              local_9760 = local_9760 + 1;
                              iVar26 = iVar26 + iVar53;
                            } while (local_9760 < uVar25);
                          }
                          uVar25 = (((int)local_96b8 + 7 >> 3) + 1) * uVar25;
                          free(local_96f0.out);
                          psVar41 = local_9680 + uVar25;
                          local_974c = local_974c - uVar25;
                          bVar2 = true;
                          unaff_RBP = local_9688;
                          lVar54 = local_96b0;
                        }
                      }
                      if (!bVar2) goto LAB_00116e50;
                      lVar54 = lVar54 + 1;
                    } while (lVar54 != 7);
                    local_96f0.out = (stbi_uc *)local_96a8;
LAB_00116bfe:
                    psVar41 = local_96f0.out;
                    if ((char)local_96c0 != '\0') {
                      iVar53 = (local_96f0.s)->img_y * (local_96f0.s)->img_x;
                      iVar26 = s->img_out_n;
                      if (local_96f0.depth == 0x10) {
                        if (iVar26 == 2) {
                          if (iVar53 != 0) {
                            lVar54 = 0;
                            do {
                              *(ushort *)((long)local_96f0.out + (lVar54 * 2 + 1) * 2) =
                                   -(ushort)(*(stbi__uint16 *)
                                              ((long)local_96f0.out + lVar54 * 2 * 2) !=
                                            local_96c6[0]);
                              lVar54 = lVar54 + 1;
                            } while (iVar53 != (int)lVar54);
                          }
                        }
                        else {
                          if (iVar26 != 4) {
                            __assert_fail("out_n == 2 || out_n == 4",
                                          "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]plutosvg/plutovg/source/plutovg-stb-image.h"
                                          ,0x134b,
                                          "int stbi__compute_transparency16(stbi__png *, stbi__uint16 *, int)"
                                         );
                          }
                          if (iVar53 != 0) {
                            psVar50 = (stbi__context *)0x0;
                            do {
                              if (((*(stbi__uint16 *)((long)local_96f0.out + (long)psVar50 * 4 * 2)
                                    == local_96c6[0]) &&
                                  (*(stbi__uint16 *)
                                    ((long)local_96f0.out + ((long)psVar50 * 4 + 1) * 2) ==
                                   local_96c6[1])) &&
                                 (*(stbi__uint16 *)
                                   ((long)local_96f0.out + ((long)psVar50 * 4 + 2) * 2) ==
                                  local_96c6[2])) {
                                *(stbi__uint16 *)
                                 ((long)local_96f0.out + ((long)psVar50 * 4 + 3) * 2) = 0;
                              }
                              psVar50 = (stbi__context *)((long)&psVar50->img_x + 1);
                            } while (iVar53 != (int)psVar50);
                          }
                        }
                      }
                      else if (iVar26 == 2) {
                        if (iVar53 != 0) {
                          lVar54 = 0;
                          do {
                            *(char *)((long)local_96f0.out + lVar54 * 2 + 1) =
                                 -((stbi_uc)*(stbi__uint16 *)((long)local_96f0.out + lVar54 * 2) !=
                                  tc[0]);
                            lVar54 = lVar54 + 1;
                          } while (iVar53 != (int)lVar54);
                        }
                      }
                      else {
                        if (iVar26 != 4) {
                          __assert_fail("out_n == 2 || out_n == 4",
                                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]plutosvg/plutovg/source/plutovg-stb-image.h"
                                        ,0x1332,
                                        "int stbi__compute_transparency(stbi__png *, stbi_uc *, int)"
                                       );
                        }
                        if (iVar53 != 0) {
                          psVar50 = (stbi__context *)0x0;
                          do {
                            if ((((stbi_uc)*(stbi__uint16 *)
                                            ((long)local_96f0.out + (long)psVar50 * 2 * 2) == tc[0])
                                && (*(stbi_uc *)((long)local_96f0.out + (long)psVar50 * 4 + 1) ==
                                    tc[1])) &&
                               ((stbi_uc)*(stbi__uint16 *)
                                          ((long)local_96f0.out + ((long)psVar50 * 2 + 1) * 2) ==
                                tc[2])) {
                              *(undefined1 *)((long)local_96f0.out + (long)psVar50 * 4 + 3) = 0;
                            }
                            psVar50 = (stbi__context *)((long)&psVar50->img_x + 1);
                          } while (iVar53 != (int)psVar50);
                        }
                      }
                    }
                    if ((char)local_9790 == '\0') {
                      if ((char)local_96c0 != '\0') {
                        s->img_n = s->img_n + 1;
                      }
                    }
                    else {
                      s->img_n = local_9790 & 0xff;
                      s->img_out_n = 4;
                      uVar22 = (local_96f0.s)->img_y * (local_96f0.s)->img_x;
                      if (uVar22 < 0x20000000) {
                        psVar35 = (stbi__uint16 *)malloc((ulong)(uVar22 * 4));
                      }
                      else {
                        psVar35 = (stbi__uint16 *)0x0;
                      }
                      if (psVar35 == (stbi__uint16 *)0x0) {
                        *(char **)(in_FS_OFFSET + -8) = "outofmem";
                      }
                      else {
                        if (uVar22 != 0) {
                          uVar38 = 0;
                          do {
                            uVar39 = (ulong)*(byte *)((long)psVar41 + uVar38);
                            *(stbi_uc *)(psVar35 + uVar38 * 2) = palette[uVar39 * 4];
                            *(stbi_uc *)((long)psVar35 + uVar38 * 4 + 1) = palette[uVar39 * 4 + 1];
                            *(stbi_uc *)(psVar35 + uVar38 * 2 + 1) = palette[uVar39 * 4 + 2];
                            *(stbi_uc *)((long)psVar35 + uVar38 * 4 + 3) = palette[uVar39 * 4 + 3];
                            uVar38 = uVar38 + 1;
                          } while (uVar22 != uVar38);
                        }
                        free(psVar41);
                        local_96f0.out = (stbi_uc *)psVar35;
                      }
                      if (psVar35 == (stbi__uint16 *)0x0) goto LAB_00116e50;
                    }
                    free(local_96f0.expanded);
                    local_96f0.expanded = (stbi_uc *)0x0;
                    stbi__get32be(s);
                    lVar54 = 1;
                  }
                  bVar4 = false;
                  goto LAB_0011676e;
                }
                pcVar31 = "no IDAT";
              }
              *(char **)(in_FS_OFFSET + -8) = pcVar31;
              goto LAB_0011676b;
            }
            if (bVar57) goto LAB_001157d4;
            if (((char)local_9790 != '\0') && (uVar46 == 0)) {
              pcVar31 = "no PLTE";
LAB_001157a8:
              *(char **)(in_FS_OFFSET + -8) = pcVar31;
              bVar57 = false;
              local_9730 = 0;
              goto LAB_0011676b;
            }
            if (0x40000000 < sVar20) {
              pcVar31 = "IDAT size limit";
              goto LAB_00116758;
            }
            uVar22 = sVar20 + uVar29;
            unaff_RBP = (ulong)uVar22;
            bVar57 = false;
            if ((int)uVar22 < (int)uVar29) goto LAB_0011676b;
            psVar33 = (stbi__context *)local_96f0.idata;
            if (uVar22 <= (uint)local_9698) {
LAB_00116728:
              local_96f0.idata = (stbi_uc *)psVar33;
              iVar26 = stbi__getn(s,(stbi_uc *)((long)local_96f0.idata + 0x38) +
                                    ((ulong)uVar29 - 0x38),sVar20);
              bVar57 = false;
              if (iVar26 == 0) {
                pcVar31 = "outofdata";
                goto LAB_00116758;
              }
              goto LAB_001163db;
            }
            if (sVar20 < 0x1001) {
              sVar34 = 0x1000;
            }
            if ((uint)local_9698 != 0) {
              sVar34 = local_9698 & 0xffffffff;
            }
            do {
              local_9698 = sVar34;
              sVar34 = (ulong)((uint)local_9698 * 2);
            } while ((uint)local_9698 < uVar22);
            psVar33 = (stbi__context *)realloc(local_96f0.idata,local_9698);
            if (psVar33 != (stbi__context *)0x0) goto LAB_00116728;
            *(char **)(in_FS_OFFSET + -8) = "outofmem";
            lVar54 = 0;
            bVar57 = false;
            bVar4 = false;
          }
        }
        else {
          if (sVar21 == 0x74524e53) {
            if (bVar57) goto LAB_001157d4;
            if ((stbi__context *)local_96f0.idata == (stbi__context *)0x0) {
              if ((char)local_9790 == '\0') {
                uVar46 = s->img_n;
                if ((uVar46 & 1) == 0) {
                  pcVar31 = "tRNS with alpha";
                }
                else {
                  if (uVar46 * 2 == sVar20) {
                    lVar40 = (long)local_96f0.depth;
                    local_96c0 = CONCAT71((uint7)(uint3)(uVar46 * 2 >> 8),1);
                    if (lVar40 == 0x10) {
                      if (0 < (int)uVar46) {
                        uVar38 = 0;
                        do {
                          bVar17 = stbi__get8(s);
                          unaff_RBP = (ulong)bVar17 << 8;
                          bVar17 = stbi__get8(s);
                          local_96c6[uVar38] = (ushort)bVar17 | (ushort)unaff_RBP;
                          bVar57 = false;
                          if (1 < uVar38) break;
                          uVar38 = uVar38 + 1;
                        } while ((long)uVar38 < (long)s->img_n);
                        local_9790 = 0;
                        goto LAB_001163db;
                      }
                    }
                    else if (0 < (int)uVar46) {
                      uVar38 = 0;
                      do {
                        stbi__get8(s);
                        sVar18 = stbi__get8(s);
                        tc[uVar38] = ""[lVar40] * sVar18;
                        if (1 < uVar38) break;
                        uVar38 = uVar38 + 1;
                      } while ((long)uVar38 < (long)s->img_n);
                      local_9790 = 0;
                      goto LAB_001165f8;
                    }
                    bVar57 = false;
                    local_9790 = 0;
                    goto LAB_001163db;
                  }
                  pcVar31 = "bad tRNS len";
                }
                *(char **)(in_FS_OFFSET + -8) = pcVar31;
                bVar57 = false;
                local_9790 = 0;
                goto LAB_0011676b;
              }
              if (uVar46 == 0) {
                pcVar31 = "tRNS before PLTE";
                goto LAB_001157a8;
              }
              if (uVar46 < sVar20) {
                pcVar31 = "bad tRNS len";
                goto LAB_00116758;
              }
              local_9790 = (uint)CONCAT71((int7)(local_9730 >> 8),4);
              bVar57 = false;
              if (sVar20 != 0) {
                uVar38 = 0;
                do {
                  sVar18 = stbi__get8(s);
                  palette[uVar38 * 4 + 3] = sVar18;
                  uVar38 = uVar38 + 1;
                } while (sVar34 != uVar38);
LAB_001165f8:
                bVar57 = false;
              }
              goto LAB_001163db;
            }
            pcVar31 = "tRNS after IDAT";
LAB_00116758:
            *(char **)(in_FS_OFFSET + -8) = pcVar31;
            bVar57 = false;
          }
          else {
            if (sVar21 != 0x504c5445) {
              if (sVar21 != 0x49484452) goto LAB_00115752;
              if (bVar57) {
                if (sVar20 != 0xd) {
                  pcVar31 = "bad IHDR len";
                  goto LAB_001163a5;
                }
                sVar20 = stbi__get32be(s);
                s->img_x = sVar20;
                sVar20 = stbi__get32be(s);
                s->img_y = sVar20;
                if ((0x1000000 < sVar20) || (0x1000000 < s->img_x)) {
                  pcVar31 = "too large";
                  goto LAB_001163a5;
                }
                bVar17 = stbi__get8(s);
                unaff_RBP = CONCAT71(extraout_var,bVar17) & 0xffffffff;
                local_96f0.depth = (int)bVar17;
                if ((0x10 < bVar17) || ((0x10116U >> (local_96f0.depth & 0x1fU) & 1) == 0)) {
                  pcVar31 = "1/2/4/8/16-bit only";
                  goto LAB_001163a5;
                }
                bVar17 = stbi__get8(s);
                uVar42 = (uint)bVar17;
                if (6 < bVar17) {
LAB_001164f4:
                  pcVar31 = "bad ctype";
                  goto LAB_001163a5;
                }
                if (bVar17 == 3) {
                  uVar38 = CONCAT71((int7)((ulong)s >> 8),3);
                  if ((char)unaff_RBP == '\x10') {
                    pcVar31 = "bad ctype";
                    uVar42 = 3;
                    goto LAB_001163a5;
                  }
                }
                else {
                  uVar38 = (ulong)local_9790;
                  if ((bVar17 & 1) != 0) goto LAB_001164f4;
                }
                sVar18 = stbi__get8(s);
                uVar46 = (uint)uVar38;
                local_9790 = uVar46;
                if (sVar18 != '\0') {
                  pcVar31 = "bad comp method";
                  goto LAB_001163a5;
                }
                sVar18 = stbi__get8(s);
                if (sVar18 != '\0') {
                  pcVar31 = "bad filter method";
                  goto LAB_001163a5;
                }
                bVar19 = stbi__get8(s);
                local_9690 = (ulong)bVar19;
                if (1 < bVar19) {
                  pcVar31 = "bad interlace method";
                  goto LAB_001163a5;
                }
                uVar23 = s->img_x;
                if ((uVar23 == 0) || (s->img_y == 0)) {
                  pcVar31 = "0-pixel image";
                  goto LAB_001163a5;
                }
                if ((char)uVar38 == '\0') {
                  uVar47 = (3 < bVar17) + 1 + (bVar17 & 2);
                  s->img_n = uVar47;
                  local_9790 = 0;
                  uVar23 = (uint)((0x40000000 / (ulong)uVar23) / (ulong)uVar47);
                }
                else {
                  s->img_n = 1;
                  uVar23 = (uint)(0x40000000 / (ulong)uVar23 >> 2);
                  psVar50 = (stbi__context *)(uVar38 & 0xffffffff);
                }
                pcVar31 = "too large";
                bVar2 = true;
                if (uVar23 < s->img_y) goto LAB_001163a5;
              }
              else {
                pcVar31 = "multiple IHDR";
LAB_001163a5:
                *(char **)(in_FS_OFFSET + -8) = pcVar31;
                bVar2 = false;
                lVar54 = 0;
                uVar46 = local_9790;
              }
              bVar57 = false;
              bVar4 = false;
              local_9790 = uVar46;
              if (bVar2) goto LAB_001163db;
              goto LAB_0011676e;
            }
            if (!bVar57) {
              if ((sVar20 < 0x301) && (local_9730 = sVar34 / 3, (sVar20 / 3) * 3 == sVar20)) {
                bVar57 = false;
                if (2 < sVar20) {
                  uVar38 = 0;
                  do {
                    sVar18 = stbi__get8(s);
                    palette[uVar38 * 4] = sVar18;
                    sVar18 = stbi__get8(s);
                    palette[uVar38 * 4 + 1] = sVar18;
                    sVar18 = stbi__get8(s);
                    palette[uVar38 * 4 + 2] = sVar18;
                    palette[uVar38 * 4 + 3] = 0xff;
                    uVar38 = uVar38 + 1;
                  } while (local_9730 != uVar38);
                  goto LAB_001165f8;
                }
                goto LAB_001163db;
              }
              pcVar31 = "invalid PLTE";
              goto LAB_00116758;
            }
LAB_001157d4:
            *(char **)(in_FS_OFFSET + -8) = "first not IHDR";
            bVar57 = true;
          }
LAB_0011676b:
          bVar4 = false;
          lVar54 = 0;
        }
LAB_0011676e:
        psVar35 = (stbi__uint16 *)local_96f0.out;
        psVar33 = local_96f0.s;
      } while (bVar4);
      if ((int)lVar54 != 0) {
        sVar20 = 8;
        if ((local_96f0.depth < 9) || (sVar20 = 0x10, local_96f0.depth == 0x10)) {
          psVar49->img_x = sVar20;
          local_96f0.out = (stbi_uc *)0x0;
          iVar26 = (local_96f0.s)->img_out_n;
          if (iVar26 != 4) {
            if (local_96f0.depth < 9) {
              psVar35 = (stbi__uint16 *)
                        stbi__convert_format
                                  ((uchar *)psVar35,iVar26,(local_96f0.s)->img_x,
                                   (local_96f0.s)->img_y,(uint)psVar50);
            }
            else {
              psVar35 = stbi__convert_format16
                                  (psVar35,iVar26,(local_96f0.s)->img_x,(local_96f0.s)->img_y,
                                   (uint)psVar50);
            }
            psVar33->img_out_n = 4;
            if (psVar35 == (stbi__uint16 *)0x0) {
              return (void *)0x0;
            }
          }
          *x = psVar33->img_x;
          *y = psVar33->img_y;
          if (comp != (int *)0x0) {
            *comp = psVar33->img_n;
          }
          goto LAB_00116f88;
        }
        pcVar31 = "bad bits_per_channel";
        goto LAB_001179da;
      }
    }
    psVar35 = (stbi__uint16 *)0x0;
LAB_00116f88:
    free(local_96f0.out);
    local_96f0.out = (stbi_uc *)0x0;
    free(local_96f0.expanded);
    local_96f0.expanded = (stbi_uc *)0x0;
    free(local_96f0.idata);
    return psVar35;
  }
  sVar18 = stbi__get8(s);
  if ((sVar18 == 'B') && (sVar18 = stbi__get8(s), sVar18 == 'M')) {
    stbi__get32le(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get32le(s);
    sVar21 = stbi__get32le(s);
    if (((0x38 < sVar21) || ((0x100010000001000U >> ((ulong)sVar21 & 0x3f) & 1) == 0)) &&
       ((sVar21 != 0x7c && (sVar21 != 0x6c)))) goto LAB_00114d58;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    sVar18 = stbi__get8(s);
    uVar29 = extraout_EDX;
    if ((sVar18 == 'B') && (sVar18 = stbi__get8(s), uVar29 = extraout_EDX_00, sVar18 == 'M')) {
      stbi__get32le(s);
      stbi__get8(s);
      stbi__get8(s);
      stbi__get8(s);
      stbi__get8(s);
      sVar21 = stbi__get32le(s);
      unaff_R15 = (stbi__context *)(ulong)sVar21;
      sVar20 = stbi__get32le(s);
      if ((int)sVar21 < 0) {
LAB_00117292:
        pcVar31 = "bad BMP";
      }
      else {
        if ((int)sVar20 < 0x38) {
          if (sVar20 == 0xc) {
            sVar18 = stbi__get8(s);
            sVar12 = stbi__get8(s);
            s->img_x = (uint)CONCAT11(sVar12,sVar18);
            sVar18 = stbi__get8(s);
            sVar12 = stbi__get8(s);
            sVar21 = (stbi__uint32)CONCAT11(sVar12,sVar18);
            goto LAB_00114cdd;
          }
          if (sVar20 == 0x28) goto LAB_00114cc9;
        }
        else if (((sVar20 == 0x38) || (sVar20 == 0x6c)) || (sVar20 == 0x7c)) {
LAB_00114cc9:
          sVar21 = stbi__get32le(s);
          s->img_x = sVar21;
          sVar21 = stbi__get32le(s);
LAB_00114cdd:
          s->img_y = sVar21;
          sVar18 = stbi__get8(s);
          sVar12 = stbi__get8(s);
          if (CONCAT11(sVar12,sVar18) != 1) goto LAB_00117292;
          sVar18 = stbi__get8(s);
          sVar12 = stbi__get8(s);
          uVar42 = (uint)CONCAT11(sVar12,sVar18);
          local_9780 = 0;
          uVar22 = 0xff;
          if (sVar20 == 0xc) {
            local_9768 = 0;
            local_9760._0_4_ = 0;
            uVar29 = 0;
            iVar53 = -0xe;
            goto LAB_00114d51;
          }
          sVar21 = stbi__get32le(s);
          if (sVar21 - 1 < 2) {
            *(char **)(in_FS_OFFSET + -8) = "BMP RLE";
            bVar57 = true;
            local_9768 = 0;
            local_9760._0_4_ = 0;
            uVar29 = 0;
            iVar26 = -0xe;
            goto LAB_0011702e;
          }
          iVar26 = -0xe;
          if ((int)sVar21 < 4) {
            if (((sVar21 != 3) || (uVar42 == 0x10)) || (uVar42 == 0x20)) {
              stbi__get32le(s);
              stbi__get32le(s);
              stbi__get32le(s);
              stbi__get32le(s);
              stbi__get32le(s);
              if ((int)sVar20 < 0x6c) {
                if (sVar20 != 0x28) {
                  if (sVar20 != 0x38) goto LAB_001183f3;
                  stbi__get32le(s);
                  stbi__get32le(s);
                  stbi__get32le(s);
                  stbi__get32le(s);
                }
                uVar22 = 0xff;
                uVar29 = 0;
                if ((uVar42 == 0x20) || (uVar42 == 0x10)) {
                  if (sVar21 != 0) {
                    if (sVar21 == 3) {
                      local_9780 = stbi__get32le(s);
                      local_9768 = stbi__get32le(s);
                      local_9760._0_4_ = stbi__get32le(s);
                      if (local_9768 != (uint)local_9760 || local_9780 != local_9768) {
                        uVar29 = 0;
                        iVar53 = -0x1a;
                        goto LAB_00114d51;
                      }
                      *(char **)(in_FS_OFFSET + -8) = "bad BMP";
                      uVar29 = 0;
                      uVar22 = 0xff;
                      iVar26 = -0x1a;
                    }
                    else {
                      *(char **)(in_FS_OFFSET + -8) = "bad BMP";
                      iVar26 = -0xe;
                      local_9780 = 0;
                      local_9768 = 0;
                      local_9760._0_4_ = 0;
                      uVar29 = 0;
                    }
LAB_0011860f:
                    bVar57 = true;
                    goto LAB_0011702e;
                  }
                  if (CONCAT11(sVar12,sVar18) == 0x10) {
                    local_9760._0_4_ = 0x1f;
                    local_9768 = 0x3e0;
                    local_9780 = 0x7c00;
LAB_001186cb:
                    uVar29 = 0;
                  }
                  else {
                    if (CONCAT11(sVar12,sVar18) != 0x20) {
                      local_9780 = 0;
                      local_9768 = 0;
                      local_9760._0_4_ = 0;
                      goto LAB_001186cb;
                    }
                    uVar29 = 0xff000000;
                    uVar22 = 0;
                    local_9760._0_4_ = 0xff;
                    local_9768 = 0xff00;
                    local_9780 = 0xff0000;
                  }
                  iVar53 = -0xe;
                }
                else {
                  local_9780 = 0;
                  local_9768 = 0;
                  local_9760._0_4_ = 0;
                  iVar53 = -0xe;
                }
              }
              else {
                if ((sVar20 == 0x6c) || (sVar20 == 0x7c)) {
                  local_9780 = stbi__get32le(s);
                  local_9768 = stbi__get32le(s);
                  local_9760._0_4_ = stbi__get32le(s);
                  uVar29 = stbi__get32le(s);
                  uVar22 = 0xff;
                  if (sVar21 == 0) {
                    if (uVar42 == 0x10) {
                      local_9760._0_4_ = 0x1f;
                      local_9768 = 0x3e0;
                      local_9780 = 0x7c00;
                    }
                    else if (uVar42 == 0x20) {
                      uVar29 = 0xff000000;
                      uVar22 = 0;
                      local_9760._0_4_ = 0xff;
                      local_9768 = 0xff00;
                      local_9780 = 0xff0000;
                    }
                    else {
                      local_9780 = 0;
                      local_9768 = 0;
                      local_9760._0_4_ = 0;
                      uVar29 = 0;
                    }
                  }
                  stbi__get32le(s);
                  iVar26 = 0xc;
                  do {
                    stbi__get32le(s);
                    iVar26 = iVar26 + -1;
                  } while (iVar26 != 0);
                  iVar26 = -0xe;
                  iVar53 = iVar26;
                  if (sVar20 == 0x6c) goto LAB_00114d51;
                  if (sVar20 != 0x7c) goto LAB_0011860f;
                  stbi__get32le(s);
                  stbi__get32le(s);
                  stbi__get32le(s);
                  stbi__get32le(s);
                }
                else {
LAB_001183f3:
                  *(char **)(in_FS_OFFSET + -8) = "bad BMP";
                  uVar22 = 0xff;
                  local_9780 = 0;
                  local_9768 = 0;
                  local_9760._0_4_ = 0;
                  uVar29 = 0;
                }
                iVar26 = -0xe;
                iVar53 = -0xe;
                if ((sVar20 | 0x10) != 0x7c) {
                  bVar57 = true;
                  goto LAB_0011702e;
                }
              }
LAB_00114d51:
              iVar26 = iVar53;
              bVar57 = false;
              goto LAB_0011702e;
            }
            pcVar31 = "bad BMP";
          }
          else {
            pcVar31 = "BMP JPEG/PNG";
          }
          *(char **)(in_FS_OFFSET + -8) = pcVar31;
          bVar57 = true;
          local_9768 = 0;
          local_9760._0_4_ = 0;
          uVar29 = 0;
          goto LAB_0011702e;
        }
        pcVar31 = "unknown BMP";
      }
      *(char **)(in_FS_OFFSET + -8) = pcVar31;
      bVar57 = true;
      uVar22 = 0xff;
      iVar26 = -0xe;
      local_9780 = 0;
      local_9768 = 0;
      local_9760._0_4_ = 0;
      uVar29 = 0;
    }
    else {
      *(char **)(in_FS_OFFSET + -8) = "not BMP";
      bVar57 = true;
      uVar22 = 0xff;
    }
LAB_0011702e:
    if (bVar57) {
      return (void *)0x0;
    }
    uVar46 = s->img_y;
    uVar23 = -uVar46;
    if (0 < (int)uVar46) {
      uVar23 = uVar46;
    }
    s->img_y = uVar23;
    if ((uVar23 < 0x1000001) && (s->img_x < 0x1000001)) {
      iVar53 = (int)unaff_R15;
      if (sVar20 == 0xc) {
        if ((int)uVar42 < 0x18) {
          uVar23 = (iVar26 + iVar53 + -0x18) / 3;
        }
        else {
LAB_00117356:
          uVar23 = 0;
        }
      }
      else {
        if (0xf < (int)uVar42) goto LAB_00117356;
        uVar23 = (int)((iVar26 - sVar20) + iVar53) >> 2;
      }
      if (uVar23 == 0) {
        iVar28 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) +
                 s->callback_already_read;
        if (iVar28 - 0x401U < 0xfffffc00) {
          pcVar31 = "bad header";
          goto LAB_001179da;
        }
        if ((iVar53 < iVar28) || (0x400 < iVar53 - iVar28)) {
          pcVar31 = "bad offset";
          goto LAB_001179da;
        }
        stbi__skip(s,iVar53 - iVar28);
      }
      uVar47 = uVar29 ^ 0xff000000;
      s->img_n = 4 - (uint)(uVar29 == 0 || uVar42 == 0x18 && uVar47 == 0);
      sVar21 = s->img_x;
      sVar27 = s->img_y;
      iVar28 = stbi__mad3sizes_valid(4,sVar21,sVar27,0);
      if (iVar28 == 0) goto LAB_001179d3;
      pvVar36 = stbi__malloc_mad3(4,sVar21,sVar27,0);
      if (pvVar36 != (void *)0x0) {
        if ((int)uVar42 < 0x10) {
          if ((int)uVar23 < 0x101 && uVar23 != 0) {
            if (0 < (int)uVar23) {
              uVar38 = 0;
              do {
                sVar18 = stbi__get8(s);
                local_9088[uVar38 * 4 + 2] = sVar18;
                sVar18 = stbi__get8(s);
                local_9088[uVar38 * 4 + 1] = sVar18;
                sVar18 = stbi__get8(s);
                local_9088[uVar38 * 4] = sVar18;
                if (sVar20 != 0xc) {
                  stbi__get8(s);
                }
                local_9088[uVar38 * 4 + 3] = 0xff;
                uVar38 = uVar38 + 1;
              } while (uVar23 != uVar38);
            }
            stbi__skip(s,uVar23 * (sVar20 == 0xc | 0xfffffffc) + (iVar26 - sVar20) + iVar53);
            if (uVar42 == 8) {
              uVar29 = s->img_x;
            }
            else if (uVar42 == 4) {
              uVar29 = s->img_x + 1 >> 1;
            }
            else {
              if (uVar42 != 1) {
                free(pvVar36);
                pcVar31 = "bad bpp";
                goto LAB_001179da;
              }
              uVar29 = s->img_x + 7 >> 3;
            }
            local_9780 = -uVar29 & 3;
            if (uVar42 == 1) {
              if (0 < (int)s->img_y) {
                lVar54 = 0;
                iVar26 = 0;
                do {
                  bVar17 = stbi__get8(s);
                  uVar42 = (uint)bVar17;
                  lVar54 = (long)(int)lVar54;
                  uVar29 = 7;
                  sVar20 = 1;
                  do {
                    sVar21 = s->img_x;
                    if ((int)sVar21 <= (int)(sVar20 - 1)) break;
                    uVar38 = (ulong)((uVar42 >> (uVar29 & 0x1f) & 1) != 0);
                    *(undefined1 *)((long)pvVar36 + lVar54) = local_9088[uVar38 * 4];
                    *(undefined1 *)((long)pvVar36 + lVar54 + 1) = local_9088[uVar38 * 4 + 1];
                    *(undefined1 *)((long)pvVar36 + lVar54 + 2) = local_9088[uVar38 * 4 + 2];
                    *(undefined1 *)((long)pvVar36 + lVar54 + 3) = 0xff;
                    if (sVar20 != sVar21) {
                      if ((int)uVar29 < 1) {
                        bVar17 = stbi__get8(s);
                        uVar42 = (uint)bVar17;
                        uVar29 = 7;
                      }
                      else {
                        uVar29 = uVar29 - 1;
                      }
                    }
                    lVar54 = lVar54 + 4;
                    bVar57 = sVar20 != sVar21;
                    sVar20 = sVar20 + 1;
                  } while (bVar57);
                  stbi__skip(s,local_9780);
                  iVar26 = iVar26 + 1;
                } while (iVar26 < (int)s->img_y);
              }
            }
            else if (0 < (int)s->img_y) {
              uVar38 = 0;
              iVar26 = 0;
              do {
                if (0 < (int)s->img_x) {
                  iVar53 = 0;
                  do {
                    bVar19 = stbi__get8(s);
                    bVar17 = bVar19 >> 4;
                    if (uVar42 != 4) {
                      bVar17 = bVar19;
                    }
                    uVar39 = (ulong)bVar17;
                    iVar28 = (int)uVar38;
                    lVar54 = (long)iVar28;
                    *(undefined1 *)((long)pvVar36 + lVar54) = local_9088[uVar39 * 4];
                    *(undefined1 *)((long)pvVar36 + lVar54 + 1) = local_9088[uVar39 * 4 + 1];
                    *(undefined1 *)((long)pvVar36 + lVar54 + 2) = local_9088[uVar39 * 4 + 2];
                    uVar38 = lVar54 + 4;
                    *(undefined1 *)((long)pvVar36 + lVar54 + 3) = 0xff;
                    sVar20 = s->img_x;
                    if (iVar53 + 1U != sVar20) {
                      uVar29 = bVar19 & 0xf;
                      if (uVar42 != 4) {
                        uVar29 = 0;
                      }
                      if (uVar42 == 8) {
                        bVar17 = stbi__get8(s);
                        uVar29 = (uint)bVar17;
                      }
                      uVar38 = (ulong)uVar29;
                      *(undefined1 *)((long)pvVar36 + lVar54 + 4) = local_9088[uVar38 * 4];
                      *(undefined1 *)((long)pvVar36 + lVar54 + 5) = local_9088[uVar38 * 4 + 1];
                      *(undefined1 *)((long)pvVar36 + lVar54 + 6) = local_9088[uVar38 * 4 + 2];
                      *(undefined1 *)((long)pvVar36 + lVar54 + 7) = 0xff;
                      uVar38 = (ulong)(iVar28 + 8);
                    }
                  } while ((iVar53 + 1U != sVar20) && (iVar53 = iVar53 + 2, iVar53 < (int)s->img_x))
                  ;
                }
                stbi__skip(s,local_9780);
                iVar26 = iVar26 + 1;
              } while (iVar26 < (int)s->img_y);
            }
            goto LAB_00117f35;
          }
          free(pvVar36);
          pcVar31 = "invalid";
          goto LAB_001179da;
        }
        stbi__skip(s,(iVar26 - sVar20) + iVar53);
        if (uVar42 == 0x18) {
          iVar26 = -3;
LAB_00117bf0:
          uVar23 = iVar26 * s->img_x & 3;
        }
        else {
          uVar23 = 0;
          if (uVar42 == 0x10) {
            iVar26 = -2;
            goto LAB_00117bf0;
          }
        }
        iVar26 = 0;
        if (uVar42 == 0x18) {
          bVar57 = false;
LAB_00117c46:
          bVar56 = false;
        }
        else {
          if (uVar42 != 0x20) {
            bVar57 = true;
            goto LAB_00117c46;
          }
          bVar56 = (local_9780 == 0xff0000 && (local_9768 == 0xff00 && (uint)local_9760 == 0xff)) &&
                   uVar47 == 0;
          bVar57 = (local_9780 != 0xff0000 || (local_9768 != 0xff00 || (uint)local_9760 != 0xff)) ||
                   uVar47 != 0;
        }
        local_9790 = 0;
        local_9740 = 0;
        local_96f8 = 0;
        local_978c = 0;
        uVar47 = 0;
        uVar24 = 0;
        local_974c = 0;
        if (bVar57) {
          if ((uint)local_9760 != 0 && (local_9768 != 0 && local_9780 != 0)) {
            iVar26 = stbi__high_bit(local_9780);
            local_978c = stbi__bitcount(local_9780);
            iVar53 = stbi__high_bit(local_9768);
            uVar47 = stbi__bitcount(local_9768);
            local_9740 = stbi__high_bit((uint)local_9760);
            uVar24 = stbi__bitcount((uint)local_9760);
            local_96f8 = stbi__high_bit(uVar29);
            local_974c = stbi__bitcount(uVar29);
            if ((((local_978c < 9) && (uVar47 < 9)) && (uVar24 < 9)) && (local_974c < 9)) {
              iVar26 = iVar26 + -7;
              local_9790 = iVar53 + -7;
              local_9740 = local_9740 + -7;
              local_96f8 = local_96f8 + -7;
              goto LAB_00117d6a;
            }
          }
          free(pvVar36);
          *(char **)(in_FS_OFFSET + -8) = "bad masks";
          bVar2 = false;
        }
        else {
LAB_00117d6a:
          bVar2 = true;
          if (0 < (int)s->img_y) {
            local_96b8 = (long)pvVar36 + 3;
            iVar28 = 0;
            iVar53 = 0;
            do {
              lVar54 = local_96b8;
              local_96b0 = CONCAT44(local_96b0._4_4_,iVar53);
              iVar53 = iVar28;
              if (bVar57) {
                if (0 < (int)s->img_x) {
                  lVar40 = 0;
                  do {
                    if (uVar42 == 0x10) {
                      sVar18 = stbi__get8(s);
                      sVar12 = stbi__get8(s);
                      sVar20 = (stbi__uint32)CONCAT11(sVar12,sVar18);
                    }
                    else {
                      sVar20 = stbi__get32le(s);
                    }
                    iVar30 = stbi__shiftsigned(sVar20 & local_9780,iVar26,local_978c);
                    *(char *)(lVar54 + lVar40 * 4 + (long)iVar28 + -3) = (char)iVar30;
                    iVar30 = stbi__shiftsigned(sVar20 & local_9768,local_9790,uVar47);
                    *(char *)(lVar54 + lVar40 * 4 + (long)iVar28 + -2) = (char)iVar30;
                    iVar30 = stbi__shiftsigned(sVar20 & (uint)local_9760,local_9740,uVar24);
                    *(char *)(lVar54 + lVar40 * 4 + (long)iVar28 + -1) = (char)iVar30;
                    if (uVar29 == 0) {
                      uVar25 = 0xff;
                    }
                    else {
                      uVar25 = stbi__shiftsigned(sVar20 & uVar29,local_96f8,local_974c);
                    }
                    uVar22 = uVar22 | uVar25;
                    *(char *)(lVar54 + lVar40 * 4 + (long)iVar28) = (char)uVar25;
                    iVar53 = iVar53 + 4;
                    lVar40 = lVar40 + 1;
                  } while ((int)lVar40 < (int)s->img_x);
                }
              }
              else if (0 < (int)s->img_x) {
                lVar40 = 0;
                do {
                  sVar18 = stbi__get8(s);
                  *(stbi_uc *)(lVar54 + lVar40 * 4 + (long)iVar28 + -1) = sVar18;
                  sVar18 = stbi__get8(s);
                  *(stbi_uc *)(lVar54 + lVar40 * 4 + (long)iVar28 + -2) = sVar18;
                  sVar18 = stbi__get8(s);
                  *(stbi_uc *)(lVar54 + lVar40 * 4 + (long)iVar28 + -3) = sVar18;
                  bVar17 = 0xff;
                  if (bVar56) {
                    bVar17 = stbi__get8(s);
                  }
                  uVar22 = uVar22 | bVar17;
                  *(byte *)(lVar54 + lVar40 * 4 + (long)iVar28) = bVar17;
                  iVar53 = iVar53 + 4;
                  lVar40 = lVar40 + 1;
                } while ((int)lVar40 < (int)s->img_x);
              }
              iVar28 = iVar53;
              stbi__skip(s,uVar23);
              iVar53 = (int)local_96b0 + 1;
            } while (iVar53 < (int)s->img_y);
            bVar2 = true;
          }
        }
        if (!bVar2) {
          return (void *)0x0;
        }
LAB_00117f35:
        if ((uVar22 == 0) && (iVar26 = s->img_x * s->img_y * 4, -1 < iVar26 + -1)) {
          lVar54 = (ulong)(iVar26 - 4) + 7;
          do {
            *(undefined1 *)((long)pvVar36 + lVar54 + -4) = 0xff;
            lVar54 = lVar54 + -4;
          } while (3 < lVar54);
        }
        if (0 < (int)uVar46) {
          uVar42 = (int)s->img_y >> 1;
          if (0 < (int)uVar42) {
            sVar20 = s->img_x;
            uVar29 = sVar20 * 4;
            uVar38 = 1;
            if (1 < (int)uVar29) {
              uVar38 = (ulong)uVar29;
            }
            uVar22 = (s->img_y - 1) * sVar20 * 4;
            uVar39 = 0;
            uVar51 = 0;
            do {
              if (0 < (int)sVar20) {
                uVar55 = 0;
                do {
                  uVar37 = *(undefined1 *)((long)pvVar36 + uVar55 + uVar39);
                  *(undefined1 *)((long)pvVar36 + uVar55 + uVar39) =
                       *(undefined1 *)((long)pvVar36 + uVar55 + uVar22);
                  *(undefined1 *)((long)pvVar36 + uVar55 + uVar22) = uVar37;
                  uVar55 = uVar55 + 1;
                } while (uVar38 != uVar55);
              }
              uVar51 = uVar51 + 1;
              uVar22 = uVar22 + sVar20 * -4;
              uVar39 = (ulong)((int)uVar39 + uVar29);
            } while (uVar51 != uVar42);
          }
        }
        *x = s->img_x;
        *y = s->img_y;
        if (comp != (int *)0x0) {
          *comp = s->img_n;
          return pvVar36;
        }
        return pvVar36;
      }
LAB_001179fa:
      pcVar31 = "outofmem";
      goto LAB_001179da;
    }
  }
  else {
LAB_00114d58:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    sVar18 = stbi__get8(s);
    if ((sVar18 == 'G') &&
       ((((sVar18 = stbi__get8(s), sVar18 == 'I' && (sVar18 = stbi__get8(s), sVar18 == 'F')) &&
         (sVar18 = stbi__get8(s), sVar18 == '8')) &&
        ((sVar18 = stbi__get8(s), sVar18 == '9' || (sVar18 == '7')))))) {
      sVar18 = stbi__get8(s);
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (sVar18 == 'a') {
        memset(local_9088,0,0x8870);
        uVar7 = local_9088._8_8_;
        if ((stbi__context *)local_9088._8_8_ != (stbi__context *)0x0) {
          if (0 < (int)(local_9088._4_4_ * local_9088._0_4_) && ((uint)local_9058 & 0x18) == 8) {
            uVar38 = 0;
            do {
              if (*(stbi_uc *)(local_9088._24_8_ + uVar38) != '\0') {
                *(undefined4 *)((stbi_uc *)(local_9088._8_8_ + 0x38) + uVar38 * 4 + -0x38) =
                     *(undefined4 *)(local_9088._16_8_ + uVar38 * 4);
              }
              uVar38 = uVar38 + 1;
            } while ((uint)(local_9088._4_4_ * local_9088._0_4_) != uVar38);
          }
          memcpy((void *)local_9088._16_8_,(void *)local_9088._8_8_,
                 (long)(int)local_9088._4_4_ * (long)(int)local_9088._0_4_ * 4);
LAB_00114e95:
          memset((void *)local_9088._24_8_,0,
                 (long)(int)local_9088._4_4_ * (long)(int)local_9088._0_4_);
          do {
            sVar18 = stbi__get8(s);
            if (sVar18 == '!') {
              sVar18 = stbi__get8(s);
              if (sVar18 == 0xf9) {
                bVar17 = stbi__get8(s);
                if (bVar17 != 4) {
                  stbi__skip(s,(uint)bVar17);
                  bVar57 = true;
                  goto LAB_0011505e;
                }
                bVar17 = stbi__get8(s);
                local_9058 = (stbi_uc *)CONCAT44(local_9058._4_4_,(uint)bVar17);
                bVar17 = stbi__get8(s);
                bVar19 = stbi__get8(s);
                local_820 = ((uint)bVar19 * 0x200 + (uint)bVar17 * 2) * 5;
                if (-1 < (long)(int)local_9060._4_4_) {
                  *(undefined1 *)((long)&local_9058 + (long)(int)local_9060._4_4_ * 4 + 7) = 0xff;
                }
                if (((ulong)local_9058 & 1) != 0) {
                  bVar17 = stbi__get8(s);
                  local_9060 = (stbi_uc *)(ulong)CONCAT14(bVar17,(int)local_9060);
                  *(undefined1 *)((long)&local_9058 + (ulong)bVar17 * 4 + 7) = 0;
                  goto LAB_001154e1;
                }
                if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0011503c:
                  s->img_buffer = s->img_buffer + 1;
                }
                else {
                  iVar26 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
                  if (0 < iVar26) goto LAB_0011503c;
                  s->img_buffer = s->img_buffer_end;
                  (*(s->io).skip)(s->io_user_data,1 - iVar26);
                }
                local_9060 = (stbi_uc *)CONCAT44(0xffffffff,(int)local_9060);
              }
LAB_001154e1:
              bVar17 = stbi__get8(s);
              bVar57 = true;
              while (bVar17 != 0) {
                stbi__skip(s,(uint)bVar17);
                bVar17 = stbi__get8(s);
              }
            }
            else if (sVar18 == ';') {
              bVar57 = false;
              unaff_R15 = s;
            }
            else if (sVar18 == ',') {
              sVar18 = stbi__get8(s);
              sVar12 = stbi__get8(s);
              sVar13 = stbi__get8(s);
              sVar14 = stbi__get8(s);
              bVar17 = stbi__get8(s);
              sVar15 = stbi__get8(s);
              bVar19 = stbi__get8(s);
              bVar16 = stbi__get8(s);
              iVar26 = (uint)CONCAT11(sVar15,bVar17) + (uint)CONCAT11(sVar12,sVar18);
              if ((int)local_9088._0_4_ < iVar26) {
LAB_00114f74:
                *(char **)(in_FS_OFFSET + -8) = "bad Image Descriptor";
              }
              else {
                iVar53 = (uint)bVar19 + (uint)bVar16 * 0x100 + (uint)CONCAT11(sVar14,sVar13);
                if ((int)local_9088._4_4_ < iVar53) goto LAB_00114f74;
                local_824 = local_9088._0_4_ * 4;
                local_83c = (uint)CONCAT11(sVar12,sVar18) << 2;
                local_838 = (uint)CONCAT11(sVar14,sVar13) * local_824;
                local_834 = iVar26 * 4;
                local_830 = iVar53 * local_824;
                local_828 = local_830;
                if (CONCAT11(sVar15,bVar17) != 0) {
                  local_828 = local_838;
                }
                local_82c = local_83c;
                bVar19 = stbi__get8(s);
                local_840 = (uint)bVar19;
                local_844 = local_824 * 8;
                if ((bVar19 & 0x40) == 0) {
                  local_844 = local_824;
                }
                local_848 = (int)(local_840 << 0x19) >> 0x1f & 3;
                if ((char)bVar19 < '\0') {
                  psVar35 = local_904c.fast + 0x1fc;
                  stbi__gif_parse_colortable
                            (s,(stbi_uc (*) [4])psVar35,2 << (bVar19 & 7),
                             -(uint)(((ulong)local_9058 & 1) == 0) | local_9060._4_4_);
                }
                else {
                  psVar35 = (stbi__uint16 *)((long)&local_9058 + 4);
                  if (((ulong)stack0xffffffffffff6f98 & 0x80) == 0) {
                    pcVar31 = "missing color table";
                    goto LAB_00115050;
                  }
                }
                local_850 = psVar35;
                bVar19 = stbi__get8(s);
                if (bVar19 < 0xd) {
                  uVar42 = 1 << (bVar19 & 0x1f);
                  uVar38 = 0;
                  do {
                    local_8868[0].fast[uVar38 * 2 + 10] = 0xffff;
                    *(char *)(local_8868[0].fast + uVar38 * 2 + 0xb) = (char)uVar38;
                    *(char *)((long)local_8868[0].fast + uVar38 * 4 + 0x17) = (char)uVar38;
                    uVar38 = uVar38 + 1;
                  } while (uVar42 != uVar38);
                  uVar47 = (2 << (bVar19 & 0x1f)) - 1;
                  local_978c = 0xffffffff;
                  bVar57 = true;
                  uVar23 = 0;
                  uVar46 = 0;
                  iVar53 = 0;
                  uVar22 = uVar47;
                  psVar50 = (stbi__context *)(ulong)bVar17;
                  iVar26 = bVar19 + 1;
                  uVar29 = uVar42 + 2;
                  do {
                    for (; iVar28 = iVar53 - iVar26, iVar53 < iVar26; iVar53 = iVar53 + 8) {
                      if (uVar23 == 0) {
                        bVar17 = stbi__get8(s);
                        unaff_R15 = (stbi__context *)local_9088._8_8_;
                        if (bVar17 == 0) goto LAB_0011542f;
                        uVar23 = (uint)bVar17;
                      }
                      uVar23 = uVar23 - 1;
                      bVar17 = stbi__get8(s);
                      uVar46 = uVar46 | (uint)bVar17 << ((byte)iVar53 & 0x1f);
                    }
                    bVar17 = (byte)iVar26;
                    uVar24 = uVar46 & uVar22;
                    bVar56 = true;
                    if (uVar24 == uVar42) {
                      local_978c = 0xffffffff;
                      iVar26 = bVar19 + 1;
                      uVar29 = uVar42 + 2;
                      uVar22 = uVar47;
LAB_001152a5:
                      bVar57 = false;
                      unaff_R15 = psVar50;
                    }
                    else if (uVar24 == uVar42 + 1) {
                      while( true ) {
                        stbi__skip(s,uVar23);
                        bVar16 = stbi__get8(s);
                        if (bVar16 == 0) break;
                        uVar23 = (uint)bVar16;
                      }
                      uVar23 = 0;
                      bVar56 = false;
                      unaff_R15 = (stbi__context *)local_9088._8_8_;
                    }
                    else {
                      if ((int)uVar29 < (int)uVar24) {
                        *(char **)(in_FS_OFFSET + -8) = "illegal code in raster";
                      }
                      else if (bVar57) {
                        *(char **)(in_FS_OFFSET + -8) = "no clear code";
                        bVar57 = true;
                      }
                      else if ((int)local_978c < 0) {
                        if (uVar24 != uVar29) goto LAB_001153cc;
                        *(char **)(in_FS_OFFSET + -8) = "illegal code in raster";
                        bVar57 = false;
                      }
                      else {
                        uVar25 = uVar29 + 1;
                        if ((int)uVar29 < 0x2000) {
                          lVar54 = (long)(int)uVar29;
                          local_8868[0].fast[lVar54 * 2 + 10] = (stbi__uint16)local_978c;
                          uVar37 = (undefined1)local_8868[0].fast[(ulong)local_978c * 2 + 0xb];
                          *(undefined1 *)(local_8868[0].fast + lVar54 * 2 + 0xb) = uVar37;
                          if (uVar24 != uVar25) {
                            uVar37 = (undefined1)local_8868[0].fast[(long)(int)uVar24 * 2 + 0xb];
                          }
                          *(undefined1 *)((long)local_8868[0].fast + lVar54 * 4 + 0x17) = uVar37;
                          uVar29 = uVar25;
LAB_001153cc:
                          stbi__out_gif_code((stbi__gif *)local_9088,(stbi__uint16)uVar24);
                          iVar53 = iVar26 + 1;
                          local_978c = uVar24;
                          if ((int)uVar29 < 0x1000 && (uVar29 & uVar22) == 0) {
                            iVar26 = iVar53;
                            uVar22 = ~(-1 << ((byte)iVar53 & 0x1f));
                          }
                          goto LAB_001152a5;
                        }
                        *(char **)(in_FS_OFFSET + -8) = "too many codes";
                        bVar57 = false;
                        uVar29 = uVar25;
                      }
                      bVar56 = false;
                      unaff_R15 = (stbi__context *)0x0;
                    }
                    uVar46 = (int)uVar46 >> (bVar17 & 0x1f);
                    iVar53 = iVar28;
                    psVar50 = unaff_R15;
                  } while (bVar56);
                }
                else {
                  unaff_R15 = (stbi__context *)0x0;
                }
LAB_0011542f:
                if (unaff_R15 != (stbi__context *)0x0) {
                  if ((stbi__context *)uVar7 == (stbi__context *)0x0) {
                    if (0 < (int)(local_9088._4_4_ * local_9088._0_4_) && 0 < iStack_9064) {
                      uVar38 = 0;
                      do {
                        if (*(stbi_uc *)(local_9088._24_8_ + uVar38) == '\0') {
                          *(undefined1 *)((long)&local_9058 + (long)iStack_9064 * 4 + 7) = 0xff;
                          *(undefined4 *)((stbi_uc *)(local_9088._8_8_ + 0x38) + uVar38 * 4 + -0x38)
                               = *(undefined4 *)((long)&local_9058 + (long)iStack_9064 * 4 + 4);
                        }
                        uVar38 = uVar38 + 1;
                        bVar57 = false;
                      } while ((uint)(local_9088._4_4_ * local_9088._0_4_) != uVar38);
                      goto LAB_0011505e;
                    }
                  }
                  bVar57 = false;
                  goto LAB_0011505e;
                }
              }
              bVar57 = false;
              unaff_R15 = (stbi__context *)0x0;
            }
            else {
              pcVar31 = "unknown code";
LAB_00115050:
              *(char **)(in_FS_OFFSET + -8) = pcVar31;
              bVar57 = false;
              unaff_R15 = (stbi__context *)0x0;
            }
LAB_0011505e:
          } while (bVar57);
          goto LAB_001176da;
        }
        sVar18 = stbi__get8(s);
        if ((((sVar18 != 'G') || (sVar18 = stbi__get8(s), sVar18 != 'I')) ||
            ((sVar18 = stbi__get8(s), sVar18 != 'F' || (sVar18 = stbi__get8(s), sVar18 != '8')))) ||
           (((sVar18 = stbi__get8(s), sVar18 != '7' && (sVar18 != '9')) ||
            (sVar18 = stbi__get8(s), sVar18 != 'a')))) {
          *(char **)(in_FS_OFFSET + -8) = "not GIF";
          unaff_R15 = (stbi__context *)0x0;
          goto LAB_001176da;
        }
        *(char **)(in_FS_OFFSET + -8) = "";
        sVar18 = stbi__get8(s);
        local_9088[1] = stbi__get8(s);
        local_9088[0] = sVar18;
        local_9088._2_2_ = 0;
        sVar18 = stbi__get8(s);
        sVar12 = stbi__get8(s);
        uVar6 = local_9088._0_8_;
        local_9088[5] = sVar12;
        local_9088[4] = sVar18;
        local_9088._0_4_ = (undefined4)uVar6;
        local_9088._6_2_ = 0;
        bVar17 = stbi__get8(s);
        stack0xffffffffffff6f98 = (stbi_uc *)CONCAT44(iStack_9064,(uint)bVar17);
        sVar18 = stbi__get8(s);
        stack0xffffffffffff6f98 = (stbi_uc *)(ulong)CONCAT14(sVar18,local_9088._32_4_);
        bVar17 = stbi__get8(s);
        local_9060 = (stbi_uc *)CONCAT44(0xffffffff,(uint)bVar17);
        if (((int)local_9088._0_4_ < 0x1000001) && ((int)local_9088._4_4_ < 0x1000001)) {
          if (comp != (int *)0x0) {
            *comp = 4;
          }
          if ((char)(byte)stack0xffffffffffff6f98 < '\0') {
            stbi__gif_parse_colortable
                      (s,(stbi_uc (*) [4])((long)&local_9058 + 4),
                       2 << ((byte)stack0xffffffffffff6f98 & 7),-1);
          }
          uVar5 = local_9088._0_4_;
          uVar11 = local_9088._4_4_;
          iVar26 = stbi__mad3sizes_valid(4,local_9088._0_4_,local_9088._4_4_,0);
          if (iVar26 == 0) goto LAB_00118619;
          iVar26 = uVar11 * uVar5;
          sVar34 = (size_t)(iVar26 * 4);
          psVar50 = (stbi__context *)malloc(sVar34);
          local_9088._8_8_ = psVar50;
          psVar41 = (stbi_uc *)malloc(sVar34);
          local_9088._16_8_ = psVar41;
          psVar32 = (stbi_uc *)malloc((long)iVar26);
          local_9088._24_8_ = psVar32;
          if ((psVar50 != (stbi__context *)0x0) &&
             (psVar41 != (stbi_uc *)0x0 && psVar32 != (stbi_uc *)0x0)) {
            memset(psVar50,0,sVar34);
            memset(psVar41,0,sVar34);
            memset(psVar32,0,(long)iVar26);
            goto LAB_00114e95;
          }
          pcVar31 = "outofmem";
        }
        else {
LAB_00118619:
          pcVar31 = "too large";
        }
        *(char **)(in_FS_OFFSET + -8) = pcVar31;
        unaff_R15 = (stbi__context *)0x0;
LAB_001176da:
        psVar50 = (stbi__context *)0x0;
        if (unaff_R15 != s) {
          psVar50 = unaff_R15;
        }
        if (psVar50 == (stbi__context *)0x0) {
          if ((stbi__context *)local_9088._8_8_ != (stbi__context *)0x0) {
            free((void *)local_9088._8_8_);
          }
          psVar50 = (stbi__context *)0x0;
        }
        else {
          *x = local_9088._0_4_;
          *y = local_9088._4_4_;
        }
        free((void *)local_9088._24_8_);
        free((void *)local_9088._16_8_);
        return psVar50;
      }
    }
    else {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
    }
    sVar20 = stbi__get32be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (sVar20 != 0x38425053) {
      iVar53 = stbi__pic_test(s);
      if (iVar53 != 0) {
        pvVar36 = stbi__pic_load(s,x,y,comp,iVar26,ri);
        return pvVar36;
      }
      iVar53 = stbi__jpeg_test(s);
      if (iVar53 != 0) {
        pvVar36 = stbi__jpeg_load(s,x,y,comp,iVar26,ri);
        return pvVar36;
      }
      iVar53 = stbi__pnm_test(s);
      if (iVar53 != 0) {
        pvVar36 = stbi__pnm_load(s,x,y,comp,req_comp,ri);
        return pvVar36;
      }
      iVar53 = stbi__hdr_test(s);
      if (iVar53 != 0) {
        data = stbi__hdr_load(s,x,y,comp,iVar26,ri);
        psVar41 = stbi__hdr_to_ldr(data,*x,*y,(int)comp);
        return psVar41;
      }
      iVar53 = stbi__tga_test(s);
      if (iVar53 != 0) {
        pvVar36 = stbi__tga_load(s,x,y,comp,iVar26,ri);
        return pvVar36;
      }
      pcVar31 = "unknown image type";
      goto LAB_001179da;
    }
    sVar20 = stbi__get32be(s);
    if (sVar20 != 0x38425053) {
      pcVar31 = "not PSD";
      goto LAB_001179da;
    }
    sVar18 = stbi__get8(s);
    sVar12 = stbi__get8(s);
    if (CONCAT11(sVar18,sVar12) != 1) {
      pcVar31 = "wrong version";
      goto LAB_001179da;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001170f1:
      s->img_buffer = s->img_buffer + 6;
    }
    else {
      iVar26 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
      if (5 < iVar26) goto LAB_001170f1;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar26);
    }
    sVar18 = stbi__get8(s);
    bVar17 = stbi__get8(s);
    uVar42 = (uint)CONCAT11(sVar18,bVar17);
    if (0x10 < uVar42) {
      pcVar31 = "wrong channel count";
      goto LAB_001179da;
    }
    sVar20 = stbi__get32be(s);
    sVar21 = stbi__get32be(s);
    if (((int)sVar20 < 0x1000001) && ((int)sVar21 < 0x1000001)) {
      sVar18 = stbi__get8(s);
      sVar12 = stbi__get8(s);
      sVar3 = CONCAT11(sVar18,sVar12);
      if ((sVar3 != 8) && (sVar3 != 0x10)) {
        pcVar31 = "unsupported bit depth";
        goto LAB_001179da;
      }
      sVar18 = stbi__get8(s);
      sVar12 = stbi__get8(s);
      if (CONCAT11(sVar18,sVar12) != 3) {
        pcVar31 = "wrong color format";
        goto LAB_001179da;
      }
      sVar27 = stbi__get32be(s);
      stbi__skip(s,sVar27);
      sVar27 = stbi__get32be(s);
      stbi__skip(s,sVar27);
      sVar27 = stbi__get32be(s);
      stbi__skip(s,sVar27);
      uVar29 = stbi__get16be(s);
      if (1 < uVar29) {
        pcVar31 = "bad compression";
        goto LAB_001179da;
      }
      iVar26 = stbi__mad3sizes_valid(4,sVar21,sVar20,0);
      if (iVar26 != 0) {
        uVar22 = sVar21 * sVar20;
        pvVar36 = malloc((long)(int)(uVar22 * 4));
        if (pvVar36 != (void *)0x0) {
          if (uVar29 == 0) {
            uVar38 = 0;
            pvVar43 = pvVar36;
            local_9758 = pvVar36;
            do {
              if (uVar38 < uVar42) {
                if (psVar49->img_x == 0x10) {
                  if (0 < (int)uVar22) {
                    lVar54 = 0;
                    do {
                      sVar18 = stbi__get8(s);
                      sVar12 = stbi__get8(s);
                      *(ushort *)((long)local_9758 + lVar54 * 8) = CONCAT11(sVar18,sVar12);
                      lVar54 = lVar54 + 1;
                    } while (uVar22 != (uint)lVar54);
                  }
                }
                else if (sVar3 == 0x10) {
                  if (0 < (int)uVar22) {
                    lVar54 = 0;
                    do {
                      sVar18 = stbi__get8(s);
                      stbi__get8(s);
                      *(stbi_uc *)((long)pvVar43 + lVar54 * 4) = sVar18;
                      lVar54 = lVar54 + 1;
                    } while (uVar22 != (uint)lVar54);
                  }
                }
                else if (0 < (int)uVar22) {
                  lVar54 = 0;
                  do {
                    sVar18 = stbi__get8(s);
                    *(stbi_uc *)((long)pvVar43 + lVar54 * 4) = sVar18;
                    lVar54 = lVar54 + 1;
                  } while (uVar22 != (uint)lVar54);
                }
              }
              else if (0 < (int)uVar22) {
                lVar54 = 0;
                do {
                  *(char *)((long)pvVar43 + lVar54 * 4) = -(uVar38 == 3);
                  lVar54 = lVar54 + 1;
                } while (uVar22 != (uint)lVar54);
              }
              uVar38 = uVar38 + 1;
              pvVar43 = (void *)((long)pvVar43 + 1);
              local_9758 = (void *)((long)local_9758 + 2);
            } while (uVar38 != 4);
          }
          else {
            stbi__skip(s,bVar17 * sVar20 * 2);
            uVar38 = 0;
            pvVar43 = pvVar36;
            do {
              if (uVar38 < uVar42) {
                iVar26 = stbi__psd_decode_rle(s,(stbi_uc *)((long)pvVar36 + uVar38),uVar22);
                if (iVar26 == 0) {
                  free(pvVar36);
                  pcVar31 = "corrupt";
                  goto LAB_001179da;
                }
              }
              else if (0 < (int)uVar22) {
                lVar54 = 0;
                do {
                  *(char *)((long)pvVar43 + lVar54 * 4) = -(uVar38 == 3);
                  lVar54 = lVar54 + 1;
                } while (uVar22 != (uint)lVar54);
              }
              uVar38 = uVar38 + 1;
              pvVar43 = (void *)((long)pvVar43 + 1);
            } while (uVar38 != 4);
          }
          if (3 < uVar42) {
            if (psVar49->img_x == 0x10) {
              if (0 < (int)uVar22) {
                uVar38 = 0;
                do {
                  uVar1 = *(ushort *)((long)pvVar36 + uVar38 * 8 + 6);
                  if ((uVar1 != 0) && (uVar1 != 0xffff)) {
                    fVar59 = 1.0 / ((float)uVar1 / 65535.0);
                    fVar58 = (1.0 - fVar59) * 65535.0;
                    *(short *)((long)pvVar36 + uVar38 * 8) =
                         (short)(int)((float)*(ushort *)((long)pvVar36 + uVar38 * 8) * fVar59 +
                                     fVar58);
                    *(short *)((long)pvVar36 + uVar38 * 8 + 2) =
                         (short)(int)((float)*(ushort *)((long)pvVar36 + uVar38 * 8 + 2) * fVar59 +
                                     fVar58);
                    *(short *)((long)pvVar36 + uVar38 * 8 + 4) =
                         (short)(int)((float)*(ushort *)((long)pvVar36 + uVar38 * 8 + 4) * fVar59 +
                                     fVar58);
                  }
                  uVar38 = uVar38 + 1;
                } while (uVar22 != uVar38);
              }
            }
            else if (0 < (int)uVar22) {
              uVar38 = 0;
              do {
                bVar17 = *(byte *)((long)pvVar36 + uVar38 * 4 + 3);
                if ((bVar17 != 0) && (bVar17 != 0xff)) {
                  fVar59 = 1.0 / ((float)bVar17 / 255.0);
                  fVar58 = (1.0 - fVar59) * 255.0;
                  *(char *)((long)pvVar36 + uVar38 * 4) =
                       (char)(int)((float)*(byte *)((long)pvVar36 + uVar38 * 4) * fVar59 + fVar58);
                  *(char *)((long)pvVar36 + uVar38 * 4 + 1) =
                       (char)(int)((float)*(byte *)((long)pvVar36 + uVar38 * 4 + 1) * fVar59 +
                                  fVar58);
                  *(char *)((long)pvVar36 + uVar38 * 4 + 2) =
                       (char)(int)((float)*(byte *)((long)pvVar36 + uVar38 * 4 + 2) * fVar59 +
                                  fVar58);
                }
                uVar38 = uVar38 + 1;
              } while (uVar22 != uVar38);
            }
          }
          if (comp != (int *)0x0) {
            *comp = 4;
          }
          *y = sVar20;
          *x = sVar21;
          return pvVar36;
        }
        goto LAB_001179fa;
      }
    }
  }
LAB_001179d3:
  pcVar31 = "too large";
LAB_001179da:
  *(char **)(in_FS_OFFSET + -8) = pcVar31;
  return (void *)0x0;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}